

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ComplexTypeInfo.cpp
# Opt level: O3

ContentSpecNode * __thiscall
xercesc_4_0::ComplexTypeInfo::convertContentSpecTree
          (ComplexTypeInfo *this,ContentSpecNode *curNode,bool checkUPA,bool bAllowCompactSyntax)

{
  NodeTypes NVar1;
  int minOccurs;
  int maxOccurs;
  ContentSpecNode *curNode_00;
  QName *pQVar2;
  ContentSpecNode *pCVar3;
  ContentSpecNode *specNode;
  uint uVar4;
  
  if (curNode == (ContentSpecNode *)0x0) {
    pCVar3 = (ContentSpecNode *)0x0;
  }
  else {
    NVar1 = curNode->fType;
    if ((checkUPA) && (pQVar2 = curNode->fElement, pQVar2 != (QName *)0x0)) {
      uVar4 = this->fUniqueURI;
      if (uVar4 == this->fContentSpecOrgURISize) {
        resizeContentSpecOrgURI(this);
        pQVar2 = curNode->fElement;
        uVar4 = this->fUniqueURI;
      }
      this->fContentSpecOrgURI[uVar4] = pQVar2->fURIId;
      uVar4 = this->fUniqueURI;
      pQVar2->fURIId = uVar4;
      this->fUniqueURI = uVar4 + 1;
    }
    minOccurs = curNode->fMinOccurs;
    maxOccurs = curNode->fMaxOccurs;
    if (((NVar1 & (Any_NS|Any)) == Any) || (NVar1 == Leaf || (NVar1 & (Any_NS|Any_Other)) == Any_NS)
       ) {
LAB_00307423:
      pCVar3 = expandContentModel(this,curNode,minOccurs,maxOccurs,bAllowCompactSyntax);
      return pCVar3;
    }
    pCVar3 = curNode;
    if (NVar1 == All || (NVar1 & (Any_NS|Any)) == Choice) {
      pCVar3 = curNode->fFirst;
      specNode = convertContentSpecTree(this,pCVar3,checkUPA,bAllowCompactSyntax);
      curNode_00 = curNode->fSecond;
      if (curNode_00 != (ContentSpecNode *)0x0) {
        if (specNode != pCVar3) {
          curNode->fFirst = specNode;
          curNode->fAdoptFirst = true;
        }
        pCVar3 = convertContentSpecTree(this,curNode_00,checkUPA,bAllowCompactSyntax);
        if (pCVar3 != curNode_00) {
          curNode->fSecond = pCVar3;
          curNode->fAdoptSecond = true;
        }
        goto LAB_00307423;
      }
      pCVar3 = expandContentModel(this,specNode,minOccurs,maxOccurs,bAllowCompactSyntax);
      curNode->fAdoptFirst = false;
      (*(curNode->super_XSerializable)._vptr_XSerializable[1])(curNode);
    }
  }
  return pCVar3;
}

Assistant:

ContentSpecNode*
ComplexTypeInfo::convertContentSpecTree(ContentSpecNode* const curNode,
                                        bool checkUPA,
                                        bool bAllowCompactSyntax) {

    if (!curNode)
        return 0;

    const ContentSpecNode::NodeTypes curType = curNode->getType();

    // When checking Unique Particle Attribution, rename leaf elements
    if (checkUPA) {
        if (curNode->getElement()) {
            if (fUniqueURI == fContentSpecOrgURISize) {
                resizeContentSpecOrgURI();
            }

            fContentSpecOrgURI[fUniqueURI] = curNode->getElement()->getURI();
            curNode->getElement()->setURI(fUniqueURI);
            fUniqueURI++;
        }
    }

    // Get the spec type of the passed node
    int minOccurs = curNode->getMinOccurs();
    int maxOccurs = curNode->getMaxOccurs();
    ContentSpecNode* retNode = curNode;

    if ((curType & 0x0f) == ContentSpecNode::Any
        || (curType & 0x0f) == ContentSpecNode::Any_Other
        || (curType & 0x0f) == ContentSpecNode::Any_NS
        || curType == ContentSpecNode::Leaf)
    {
        retNode =  expandContentModel(curNode, minOccurs, maxOccurs, bAllowCompactSyntax);
    }
    else if (((curType & 0x0f) == ContentSpecNode::Choice)
        ||   (curType == ContentSpecNode::All)
        ||   ((curType & 0x0f) == ContentSpecNode::Sequence))
    {
        ContentSpecNode* childNode = curNode->getFirst();
        ContentSpecNode* leftNode;
        try
        {
            leftNode = convertContentSpecTree(childNode, checkUPA, bAllowCompactSyntax);
        }
        catch( const OutOfMemoryException& )
        {
            curNode->setAdoptFirst(false);
            delete curNode;
            throw;
        }
        ContentSpecNode* rightNode = curNode->getSecond();

        if (!rightNode) {

            try
            {
                retNode = expandContentModel(leftNode, minOccurs, maxOccurs, bAllowCompactSyntax);
            }
            catch( const OutOfMemoryException& )
            {
                curNode->setAdoptFirst(false);
                delete curNode;
                throw;
            }
            curNode->setAdoptFirst(false);
            delete curNode;
            return retNode;
        }

        if (leftNode != childNode) {

            curNode->setAdoptFirst(false);
            curNode->setFirst(leftNode);
            curNode->setAdoptFirst(true);
        }

        childNode = rightNode;
        try
        {
            rightNode =  convertContentSpecTree(childNode, checkUPA, bAllowCompactSyntax);
        }
        catch( const OutOfMemoryException& )
        {
            curNode->setAdoptSecond(false);
            delete curNode;
            throw;
        }

        if (rightNode != childNode) {

            curNode->setAdoptSecond(false);
            curNode->setSecond(rightNode);
            curNode->setAdoptSecond(true);
        }

        retNode =  expandContentModel(curNode, minOccurs, maxOccurs, bAllowCompactSyntax);
    }

    return retNode;
}